

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool IsValidSignatureEncoding(vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  byte *pbVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  long in_FS_OFFSET;
  uint lenS;
  uint lenR;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  undefined1 local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_ffffffffffffffb8);
  if (sVar5 < 9) {
    local_9 = false;
  }
  else {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffb8);
    if (sVar5 < 0x4a) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_stack_ffffffffffffffc8,
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      if (*pvVar6 == '0') {
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_stack_ffffffffffffffc8,
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        bVar1 = *pbVar7;
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (in_stack_ffffffffffffffb8);
        if ((ulong)bVar1 == sVar5 - 3) {
          pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (in_stack_ffffffffffffffc8,
                              CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
          uVar3 = (uint)*pbVar7;
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (in_stack_ffffffffffffffb8);
          if (uVar3 + 5 < sVar5) {
            pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (in_stack_ffffffffffffffc8,
                                CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
            uVar4 = (uint)*pbVar7;
            this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (ulong)(uVar3 + uVar4 + 7);
            pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               (in_stack_ffffffffffffffb8);
            if (this == pvVar8) {
              pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (this,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                                 );
              if (*pvVar6 == '\x02') {
                if (uVar3 == 0) {
                  local_9 = false;
                }
                else {
                  pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     (this,CONCAT17(in_stack_ffffffffffffffc7,
                                                    in_stack_ffffffffffffffc0));
                  if ((*pbVar7 & 0x80) == 0) {
                    if (1 < uVar3) {
                      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                               operator[](this,CONCAT17(in_stack_ffffffffffffffc7,
                                                        in_stack_ffffffffffffffc0));
                      if (*pvVar6 == '\0') {
                        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                 operator[](this,CONCAT17(in_stack_ffffffffffffffc7,
                                                          in_stack_ffffffffffffffc0));
                        if ((*pbVar7 & 0x80) == 0) {
                          local_9 = false;
                          goto LAB_008ace57;
                        }
                      }
                    }
                    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                       (this,CONCAT17(in_stack_ffffffffffffffc7,
                                                      in_stack_ffffffffffffffc0));
                    if (*pvVar6 == '\x02') {
                      if (uVar4 == 0) {
                        local_9 = false;
                      }
                      else {
                        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                 operator[](this,CONCAT17(in_stack_ffffffffffffffc7,
                                                          in_stack_ffffffffffffffc0));
                        if ((*pbVar7 & 0x80) == 0) {
                          if (1 < uVar4) {
                            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     operator[](this,CONCAT17(in_stack_ffffffffffffffc7,
                                                              in_stack_ffffffffffffffc0));
                            if (*pvVar6 == '\0') {
                              pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       operator[](this,CONCAT17(in_stack_ffffffffffffffc7,
                                                                in_stack_ffffffffffffffc0));
                              if ((*pbVar7 & 0x80) == 0) {
                                local_9 = false;
                                goto LAB_008ace57;
                              }
                            }
                          }
                          local_9 = true;
                        }
                        else {
                          local_9 = false;
                        }
                      }
                    }
                    else {
                      local_9 = false;
                    }
                  }
                  else {
                    local_9 = false;
                  }
                }
              }
              else {
                local_9 = false;
              }
            }
            else {
              local_9 = false;
            }
          }
          else {
            local_9 = false;
          }
        }
        else {
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
LAB_008ace57:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool static IsValidSignatureEncoding(const std::vector<unsigned char> &sig) {
    // Format: 0x30 [total-length] 0x02 [R-length] [R] 0x02 [S-length] [S] [sighash]
    // * total-length: 1-byte length descriptor of everything that follows,
    //   excluding the sighash byte.
    // * R-length: 1-byte length descriptor of the R value that follows.
    // * R: arbitrary-length big-endian encoded R value. It must use the shortest
    //   possible encoding for a positive integer (which means no null bytes at
    //   the start, except a single one when the next byte has its highest bit set).
    // * S-length: 1-byte length descriptor of the S value that follows.
    // * S: arbitrary-length big-endian encoded S value. The same rules apply.
    // * sighash: 1-byte value indicating what data is hashed (not part of the DER
    //   signature)

    // Minimum and maximum size constraints.
    if (sig.size() < 9) return false;
    if (sig.size() > 73) return false;

    // A signature is of type 0x30 (compound).
    if (sig[0] != 0x30) return false;

    // Make sure the length covers the entire signature.
    if (sig[1] != sig.size() - 3) return false;

    // Extract the length of the R element.
    unsigned int lenR = sig[3];

    // Make sure the length of the S element is still inside the signature.
    if (5 + lenR >= sig.size()) return false;

    // Extract the length of the S element.
    unsigned int lenS = sig[5 + lenR];

    // Verify that the length of the signature matches the sum of the length
    // of the elements.
    if ((size_t)(lenR + lenS + 7) != sig.size()) return false;

    // Check whether the R element is an integer.
    if (sig[2] != 0x02) return false;

    // Zero-length integers are not allowed for R.
    if (lenR == 0) return false;

    // Negative numbers are not allowed for R.
    if (sig[4] & 0x80) return false;

    // Null bytes at the start of R are not allowed, unless R would
    // otherwise be interpreted as a negative number.
    if (lenR > 1 && (sig[4] == 0x00) && !(sig[5] & 0x80)) return false;

    // Check whether the S element is an integer.
    if (sig[lenR + 4] != 0x02) return false;

    // Zero-length integers are not allowed for S.
    if (lenS == 0) return false;

    // Negative numbers are not allowed for S.
    if (sig[lenR + 6] & 0x80) return false;

    // Null bytes at the start of S are not allowed, unless S would otherwise be
    // interpreted as a negative number.
    if (lenS > 1 && (sig[lenR + 6] == 0x00) && !(sig[lenR + 7] & 0x80)) return false;

    return true;
}